

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicUsage::Cleanup(BasicUsage *this)

{
  BasicUsage *this_local;
  
  if ((this->pipeline & 1U) == 0) {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo);
  }
  else {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vsp);
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_fsp);
    glu::CallLogWrapper::glDeleteProgramPipelines
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_ppo);
  }
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vbo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		if (pipeline)
		{
			glDeleteProgram(m_vsp);
			glDeleteProgram(m_fsp);
			glDeleteProgramPipelines(1, &m_ppo);
		}
		else
		{
			glUseProgram(0);
			glDeleteProgram(m_ppo);
		}
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_vbo);
		return NO_ERROR;
	}